

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

long duckdb::BinaryLambdaWrapper::
     Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
               (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
               idx_t idx)

{
  string_t tgt;
  string_t str;
  int64_t iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  anon_class_8_1_6971b95b *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  
  str.value.pointer.ptr = (char *)in_R8;
  str.value._0_8_ = in_RCX;
  tgt.value.pointer.ptr = (char *)in_R9;
  tgt.value._0_8_ = in_RDX;
  iVar1 = LevenshteinFunction::anon_class_8_1_6971b95b::operator()(in_RSI,str,tgt);
  return iVar1;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}